

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_lz4.c
# Opt level: O0

int archive_filter_lz4_options(archive_write_filter *f,char *key,char *value)

{
  int *piVar1;
  int iVar2;
  int val;
  private_data_conflict6 *data;
  char *value_local;
  char *key_local;
  archive_write_filter *f_local;
  
  piVar1 = (int *)f->data;
  iVar2 = strcmp(key,"compression-level");
  if (iVar2 == 0) {
    if (((value == (char *)0x0) || (iVar2 = *value + -0x30, iVar2 < 1)) ||
       ((9 < iVar2 || (value[1] != '\0')))) {
      f_local._4_4_ = -0x14;
    }
    else if (iVar2 < 3) {
      *piVar1 = iVar2;
      f_local._4_4_ = 0;
    }
    else {
      archive_set_error(f->archive,0x16,"High compression not included in this build");
      f_local._4_4_ = -0x1e;
    }
  }
  else {
    iVar2 = strcmp(key,"stream-checksum");
    if (iVar2 == 0) {
      *(ushort *)(piVar1 + 1) =
           *(ushort *)(piVar1 + 1) & 0xffdf | (ushort)(value != (char *)0x0) << 5;
      f_local._4_4_ = 0;
    }
    else {
      iVar2 = strcmp(key,"block-checksum");
      if (iVar2 == 0) {
        *(ushort *)(piVar1 + 1) =
             *(ushort *)(piVar1 + 1) & 0xfff7 | (ushort)(value != (char *)0x0) << 3;
        f_local._4_4_ = 0;
      }
      else {
        iVar2 = strcmp(key,"block-size");
        if (iVar2 == 0) {
          if ((((value == (char *)0x0) || (*value < '4')) || ('7' < *value)) || (value[1] != '\0'))
          {
            f_local._4_4_ = -0x14;
          }
          else {
            *(ushort *)(piVar1 + 1) =
                 *(ushort *)(piVar1 + 1) & 0xfc7f | ((short)*value - 0x30U & 7) << 7;
            f_local._4_4_ = 0;
          }
        }
        else {
          iVar2 = strcmp(key,"block-dependence");
          if (iVar2 == 0) {
            *(ushort *)(piVar1 + 1) =
                 *(ushort *)(piVar1 + 1) & 0xfffb | (ushort)(value == (char *)0x0) << 2;
            f_local._4_4_ = 0;
          }
          else {
            f_local._4_4_ = -0x14;
          }
        }
      }
    }
  }
  return f_local._4_4_;
}

Assistant:

static int
archive_filter_lz4_options(struct archive_write_filter *f,
    const char *key, const char *value)
{
	struct private_data *data = (struct private_data *)f->data;

	if (strcmp(key, "compression-level") == 0) {
		int val;
		if (value == NULL || !((val = value[0] - '0') >= 1 && val <= 9) ||
		    value[1] != '\0')
			return (ARCHIVE_WARN);

#ifndef HAVE_LZ4HC_H
		if(val >= 3)
		{
			archive_set_error(f->archive, ARCHIVE_ERRNO_PROGRAMMER,
				"High compression not included in this build");
			return (ARCHIVE_FATAL);
		}
#endif
		data->compression_level = val;
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "stream-checksum") == 0) {
		data->stream_checksum = value != NULL;
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "block-checksum") == 0) {
		data->block_checksum = value != NULL;
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "block-size") == 0) {
		if (value == NULL || !(value[0] >= '4' && value[0] <= '7') ||
		    value[1] != '\0')
			return (ARCHIVE_WARN);
		data->block_maximum_size = value[0] - '0';
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "block-dependence") == 0) {
		data->block_independence = value == NULL;
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}